

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveAsName(Parse *pParse,ExprList *pEList,Expr *pE)

{
  int iVar1;
  char *in_RDX;
  int *in_RSI;
  char *zCol;
  int i;
  char *in_stack_ffffffffffffffc8;
  int local_24;
  
  if (*in_RDX == '<') {
    for (local_24 = 0; local_24 < *in_RSI; local_24 = local_24 + 1) {
      if (((*(ushort *)((long)in_RSI + (long)local_24 * 0x18 + 0x19) & 3) == 0) &&
         (iVar1 = sqlite3_stricmp(in_stack_ffffffffffffffc8,(char *)0x1e2ca6), iVar1 == 0)) {
        return local_24 + 1;
      }
    }
  }
  return 0;
}

Assistant:

static int resolveAsName(
  Parse *pParse,     /* Parsing context for error messages */
  ExprList *pEList,  /* List of expressions to scan */
  Expr *pE           /* Expression we are trying to match */
){
  int i;             /* Loop counter */

  UNUSED_PARAMETER(pParse);

  if( pE->op==TK_ID ){
    const char *zCol;
    assert( !ExprHasProperty(pE, EP_IntValue) );
    zCol = pE->u.zToken;
    for(i=0; i<pEList->nExpr; i++){
      if( pEList->a[i].fg.eEName==ENAME_NAME
       && sqlite3_stricmp(pEList->a[i].zEName, zCol)==0
      ){
        return i+1;
      }
    }
  }
  return 0;
}